

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio.c
# Opt level: O0

void al_fill_silence(void *buf,uint samples,ALLEGRO_AUDIO_DEPTH depth,ALLEGRO_CHANNEL_CONF chan_conf
                    )

{
  size_t sVar1;
  size_t sVar2;
  ulong __n;
  ALLEGRO_CHANNEL_CONF in_ECX;
  ALLEGRO_AUDIO_DEPTH in_EDX;
  uint in_ESI;
  void *in_RDI;
  size_t i_1;
  size_t n_1;
  uint32_t *buffer_1;
  size_t i;
  size_t n;
  uint16_t *buffer;
  size_t bytes;
  ulong local_50;
  ulong local_38;
  
  sVar1 = al_get_audio_depth_size(in_EDX);
  sVar2 = al_get_channel_count(in_ECX);
  __n = in_ESI * sVar1 * sVar2;
  switch(in_EDX) {
  case ALLEGRO_AUDIO_DEPTH_INT8:
  case ALLEGRO_AUDIO_DEPTH_INT16:
  case ALLEGRO_AUDIO_DEPTH_INT24:
  case ALLEGRO_AUDIO_DEPTH_FLOAT32:
    memset(in_RDI,0,__n);
    break;
  default:
    break;
  case ALLEGRO_AUDIO_DEPTH_UINT8:
    memset(in_RDI,0x80,__n);
    break;
  case ALLEGRO_AUDIO_DEPTH_UINT16:
    for (local_38 = 0; local_38 < __n >> 1; local_38 = local_38 + 1) {
      *(undefined2 *)((long)in_RDI + local_38 * 2) = 0x8000;
    }
    break;
  case ALLEGRO_AUDIO_DEPTH_UINT24:
    for (local_50 = 0; local_50 < __n >> 2; local_50 = local_50 + 1) {
      *(undefined4 *)((long)in_RDI + local_50 * 4) = 0x800000;
    }
  }
  return;
}

Assistant:

void al_fill_silence(void *buf, unsigned int samples,
   ALLEGRO_AUDIO_DEPTH depth, ALLEGRO_CHANNEL_CONF chan_conf)
{
   size_t bytes = samples * al_get_audio_depth_size(depth) *
      al_get_channel_count(chan_conf);

   switch (depth) {
      case ALLEGRO_AUDIO_DEPTH_INT8:
      case ALLEGRO_AUDIO_DEPTH_INT16:
      case ALLEGRO_AUDIO_DEPTH_INT24:
      case ALLEGRO_AUDIO_DEPTH_FLOAT32:
         memset(buf, 0, bytes);
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT8:
         memset(buf, 0x80, bytes);
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT16:
         {
            uint16_t *buffer = buf;
            size_t n = bytes / sizeof(uint16_t);
            size_t i;

            for (i = 0; i < n; i++)
               buffer[i] = 0x8000;
         }
         break;
      case ALLEGRO_AUDIO_DEPTH_UINT24:
         {
            uint32_t *buffer = buf;
            size_t n = bytes / sizeof(uint32_t);
            size_t i;

            for (i = 0; i < n; i++)
               buffer[i] = 0x800000;
         }
         break;
      default:
         ASSERT(false);
         break;
   }
}